

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O0

bool google::protobuf::
     InsertIfNotPresent<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
               (unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                *collection,first_type *key,second_type *value)

{
  bool bVar1;
  value_type *in_RDX;
  pair<const_google::protobuf::EnumDescriptor_*,_int> *in_RSI;
  pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>
  local_30;
  
  std::
  pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>
  ::
  pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_true>
            (&local_30,in_RSI,(EnumValueDescriptor **)in_RDX);
  bVar1 = InsertIfNotPresent<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                    ((unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                      *)in_RSI,in_RDX);
  return bVar1;
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}